

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

char ** SoapySDRDevice_listGains(SoapySDRDevice *device,int direction,size_t channel,size_t *length)

{
  char **ppcVar1;
  size_t *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  exception *ex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb0;
  undefined1 local_40 [16];
  size_t in_stack_ffffffffffffffd0;
  
  *in_RCX = 0;
  SoapySDRDevice_clearError();
  (**(code **)(*in_RDI + 0x168))(local_40,in_RDI,in_ESI,in_RDX);
  ppcVar1 = toStrArray(in_RDX,in_RCX,in_stack_ffffffffffffffd0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffffb0);
  return ppcVar1;
}

Assistant:

char **SoapySDRDevice_listGains(const SoapySDRDevice *device, const int direction, const size_t channel, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toStrArray(device->listGains(direction, channel), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}